

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O1

string * Disassembler::iType(string *__return_storage_ptr__,string *bin,int line)

{
  undefined4 uVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong **ppuVar8;
  long lVar9;
  undefined8 uVar10;
  uint uVar11;
  uint uVar12;
  ulong *puVar13;
  size_type *psVar14;
  pointer ppVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  ulong **ppuVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string label;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string op;
  string imm;
  string rt;
  string rs;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  ulong **local_210;
  undefined8 local_208;
  ulong *local_200;
  undefined8 uStack_1f8;
  ulong **local_1f0;
  long local_1e8;
  ulong *local_1e0;
  undefined8 uStack_1d8;
  ulong **local_1d0;
  long local_1c8;
  ulong *local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong **local_190 [2];
  ulong *local_180 [2];
  string local_170;
  ulong *local_150 [2];
  ulong local_140 [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)bin);
  AsmFuncts::getOpCode(&local_170,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)bin);
  AsmFuncts::getRegCode(&local_110,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_90,(ulong)bin);
  AsmFuncts::getRegCode(&local_130,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)bin);
  uVar4 = Conversion::binToDec(&local_b0);
  uVar17 = -uVar4;
  if (0 < (int)uVar4) {
    uVar17 = uVar4;
  }
  uVar19 = 1;
  if (9 < uVar17) {
    uVar16 = (ulong)uVar17;
    uVar12 = 4;
    do {
      uVar19 = uVar12;
      uVar11 = (uint)uVar16;
      if (uVar11 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_001266ee;
      }
      if (uVar11 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_001266ee;
      }
      if (uVar11 < 10000) goto LAB_001266ee;
      uVar16 = uVar16 / 10000;
      uVar12 = uVar19 + 4;
    } while (99999 < uVar11);
    uVar19 = uVar19 + 1;
  }
LAB_001266ee:
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct((ulong)local_150,(char)uVar19 - (char)((int)uVar4 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar4 >> 0x1f) + (long)local_150[0]),uVar19,uVar17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_170);
  if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_170), iVar5 == 0)) {
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,local_170._M_dataplus._M_p,
               local_170._M_dataplus._M_p + local_170._M_string_length);
    std::__cxx11::string::append((char *)local_190);
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_190,(ulong)local_130._M_dataplus._M_p);
    ppuVar8 = (ulong **)(plVar6 + 2);
    if ((ulong **)*plVar6 == ppuVar8) {
      local_1c0 = *ppuVar8;
      lStack_1b8 = plVar6[3];
      local_1d0 = &local_1c0;
    }
    else {
      local_1c0 = *ppuVar8;
      local_1d0 = (ulong **)*plVar6;
    }
    local_1c8 = plVar6[1];
    *plVar6 = (long)ppuVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
    puVar13 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar13) {
      local_1a0 = *puVar13;
      lStack_198 = puVar7[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar13;
      local_1b0 = (ulong *)*puVar7;
    }
    local_1a8 = puVar7[1];
    *puVar7 = puVar13;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_150[0]);
    local_210 = &local_200;
    ppuVar8 = (ulong **)(puVar7 + 2);
    if ((ulong **)*puVar7 == ppuVar8) {
      local_200 = *ppuVar8;
      uStack_1f8 = puVar7[3];
    }
    else {
      local_200 = *ppuVar8;
      local_210 = (ulong **)*puVar7;
    }
    local_208 = puVar7[1];
    *puVar7 = ppuVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_210);
    puVar13 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar13) {
      local_220 = *puVar13;
      lStack_218 = plVar6[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar13;
      local_230 = (ulong *)*plVar6;
    }
    local_228 = plVar6[1];
    *plVar6 = (long)puVar13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_110._M_dataplus._M_p);
    ppuVar8 = (ulong **)(puVar7 + 2);
    if ((ulong **)*puVar7 == ppuVar8) {
      local_1e0 = *ppuVar8;
      uStack_1d8 = puVar7[3];
      local_1f0 = &local_1e0;
    }
    else {
      local_1e0 = *ppuVar8;
      local_1f0 = (ulong **)*puVar7;
    }
    local_1e8 = puVar7[1];
    *puVar7 = ppuVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar14 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar14) {
      lVar9 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    ppuVar8 = local_190[0];
    if (local_190[0] == local_180) goto LAB_00126b32;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&local_170);
    if (iVar5 == 0) {
      ppuVar20 = &local_200;
      local_210 = ppuVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      std::__cxx11::string::append((char *)&local_210);
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_130._M_dataplus._M_p)
      ;
      puVar13 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar13) {
        local_220 = *puVar13;
        lStack_218 = puVar7[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar13;
        local_230 = (ulong *)*puVar7;
      }
      local_228 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
      ppuVar8 = (ulong **)(puVar7 + 2);
      if ((ulong **)*puVar7 == ppuVar8) {
        local_1e0 = *ppuVar8;
        uStack_1d8 = puVar7[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *ppuVar8;
        local_1f0 = (ulong **)*puVar7;
      }
      local_1e8 = puVar7[1];
      *puVar7 = ppuVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_150[0]);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar14) {
        lVar9 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      ppuVar8 = local_210;
      if (local_230 != &local_220) {
        operator_delete(local_230);
        ppuVar8 = local_210;
      }
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)&local_170);
      if ((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_170), iVar5 == 0)) {
        uVar17 = -labelCount;
        if (0 < labelCount) {
          uVar17 = labelCount;
        }
        uVar4 = 1;
        if (9 < uVar17) {
          uVar16 = (ulong)uVar17;
          uVar19 = 4;
          do {
            uVar4 = uVar19;
            uVar12 = (uint)uVar16;
            if (uVar12 < 100) {
              uVar4 = uVar4 - 2;
              goto LAB_00126f63;
            }
            if (uVar12 < 1000) {
              uVar4 = uVar4 - 1;
              goto LAB_00126f63;
            }
            if (uVar12 < 10000) goto LAB_00126f63;
            uVar16 = uVar16 / 10000;
            uVar19 = uVar4 + 4;
          } while (99999 < uVar12);
          uVar4 = uVar4 + 1;
        }
LAB_00126f63:
        uVar19 = (uint)labelCount >> 0x1f;
        local_230 = &local_220;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_230,(char)uVar4 - (char)(labelCount >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)uVar19 + (long)local_230),uVar4,uVar17);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,0x12b0f9);
        local_1f0 = &local_1e0;
        ppuVar8 = (ulong **)(puVar7 + 2);
        if ((ulong **)*puVar7 == ppuVar8) {
          local_1e0 = *ppuVar8;
          uStack_1d8 = puVar7[3];
        }
        else {
          local_1e0 = *ppuVar8;
          local_1f0 = (ulong **)*puVar7;
        }
        local_1e8 = puVar7[1];
        *puVar7 = ppuVar8;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        puVar13 = local_150[0];
        ppuVar8 = (ulong **)__errno_location();
        uVar1 = *(undefined4 *)ppuVar8;
        *(undefined4 *)ppuVar8 = 0;
        lVar9 = strtol((char *)puVar13,(char **)&local_230,10);
        if (local_230 == puVar13) {
          std::__throw_invalid_argument("stoi");
LAB_0012765e:
          uVar10 = std::__throw_out_of_range("stoi");
          if (local_230 != &local_220) {
            operator_delete(local_230);
          }
          if (local_210 != &local_230) {
            operator_delete(local_210);
          }
          if (local_1b0 != puVar13) {
            operator_delete(local_1b0);
          }
          if (local_1d0 != ppuVar8) {
            operator_delete(local_1d0);
          }
          if (local_190[0] != (ulong **)(ulong)(uint)line) {
            operator_delete(local_190[0]);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0);
          }
          if (local_150[0] != local_140) {
            operator_delete(local_150[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          _Unwind_Resume(uVar10);
        }
        iVar5 = (int)lVar9;
        if ((iVar5 != lVar9) || (*(int *)ppuVar8 == 0x22)) goto LAB_0012765e;
        if (*(int *)ppuVar8 == 0) {
          *(undefined4 *)ppuVar8 = uVar1;
        }
        uVar17 = iVar5 + line + 1;
        lVar9 = (long)labels_abi_cxx11_.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)labels_abi_cxx11_.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = lVar9 != 0;
        if (lVar9 == 0) {
LAB_001270cf:
          if (bVar2) goto LAB_001270d8;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_1f0,local_1e8 + (long)local_1f0);
          addLabel(uVar17,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          local_190[0] = local_180;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          std::__cxx11::string::append((char *)local_190);
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_190,(ulong)local_110._M_dataplus._M_p);
          local_1d0 = &local_1c0;
          ppuVar8 = (ulong **)(puVar7 + 2);
          if ((ulong **)*puVar7 == ppuVar8) {
            local_1c0 = *ppuVar8;
            lStack_1b8 = puVar7[3];
          }
          else {
            local_1c0 = *ppuVar8;
            local_1d0 = (ulong **)*puVar7;
          }
          local_1c8 = puVar7[1];
          *puVar7 = ppuVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
          local_1b0 = &local_1a0;
          puVar13 = puVar7 + 2;
          if ((ulong *)*puVar7 == puVar13) {
            local_1a0 = *puVar13;
            lStack_198 = puVar7[3];
          }
          else {
            local_1a0 = *puVar13;
            local_1b0 = (ulong *)*puVar7;
          }
          local_1a8 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_130._M_dataplus._M_p);
          local_210 = &local_200;
          ppuVar8 = (ulong **)(puVar7 + 2);
          if ((ulong **)*puVar7 == ppuVar8) {
            local_200 = *ppuVar8;
            uStack_1f8 = puVar7[3];
          }
          else {
            local_200 = *ppuVar8;
            local_210 = (ulong **)*puVar7;
          }
          local_208 = puVar7[1];
          *puVar7 = ppuVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
          local_230 = &local_220;
          puVar13 = puVar7 + 2;
          if ((ulong *)*puVar7 == puVar13) {
            local_220 = *puVar13;
            lStack_218 = puVar7[3];
          }
          else {
            local_220 = *puVar13;
            local_230 = (ulong *)*puVar7;
          }
          local_228 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1f0);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar14 = (size_type *)(plVar6 + 2);
          if ((size_type *)*plVar6 == psVar14) {
            lVar9 = plVar6[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
            *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
          }
          __return_storage_ptr__->_M_string_length = plVar6[1];
          *plVar6 = (long)psVar14;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
        }
        else {
          uVar16 = (lVar9 >> 3) * -0x3333333333333333;
          iVar5 = line + iVar5 + 3;
          if ((labels_abi_cxx11_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->first != iVar5) {
            uVar3 = 1;
            ppVar15 = labels_abi_cxx11_.
                      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar18 = uVar3;
              ppVar15 = ppVar15 + 1;
              if (uVar16 + (uVar16 == 0) == uVar18) break;
              uVar3 = uVar18 + 1;
            } while (ppVar15->first != iVar5);
            bVar2 = uVar18 <= uVar16 && uVar16 - uVar18 != 0;
            goto LAB_001270cf;
          }
LAB_001270d8:
          local_190[0] = local_180;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_190,local_170._M_dataplus._M_p,
                     local_170._M_dataplus._M_p + local_170._M_string_length);
          std::__cxx11::string::append((char *)local_190);
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)local_190,(ulong)local_110._M_dataplus._M_p);
          local_1d0 = &local_1c0;
          ppuVar8 = (ulong **)(puVar7 + 2);
          if ((ulong **)*puVar7 == ppuVar8) {
            local_1c0 = *ppuVar8;
            lStack_1b8 = puVar7[3];
          }
          else {
            local_1c0 = *ppuVar8;
            local_1d0 = (ulong **)*puVar7;
          }
          local_1c8 = puVar7[1];
          *puVar7 = ppuVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d0);
          local_1b0 = &local_1a0;
          puVar13 = puVar7 + 2;
          if ((ulong *)*puVar7 == puVar13) {
            local_1a0 = *puVar13;
            lStack_198 = puVar7[3];
          }
          else {
            local_1a0 = *puVar13;
            local_1b0 = (ulong *)*puVar7;
          }
          local_1a8 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_1b0,(ulong)local_130._M_dataplus._M_p);
          local_210 = &local_200;
          ppuVar8 = (ulong **)(puVar7 + 2);
          if ((ulong **)*puVar7 == ppuVar8) {
            local_200 = *ppuVar8;
            uStack_1f8 = puVar7[3];
          }
          else {
            local_200 = *ppuVar8;
            local_210 = (ulong **)*puVar7;
          }
          local_208 = puVar7[1];
          *puVar7 = ppuVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_210);
          local_230 = &local_220;
          puVar13 = puVar7 + 2;
          if ((ulong *)*puVar7 == puVar13) {
            local_220 = *puVar13;
            lStack_218 = puVar7[3];
          }
          else {
            local_220 = *puVar13;
            local_230 = (ulong *)*puVar7;
          }
          local_228 = puVar7[1];
          *puVar7 = puVar13;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          getLabel_abi_cxx11_(&local_f0,(Disassembler *)(ulong)uVar17,(int)local_228);
          uVar16 = 0xf;
          if (local_230 != &local_220) {
            uVar16 = local_220;
          }
          if (uVar16 < local_f0._M_string_length + local_228) {
            uVar10 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar10 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar10 < local_f0._M_string_length + local_228) goto LAB_001273cc;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_230);
          }
          else {
LAB_001273cc:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_230,(ulong)local_f0._M_dataplus._M_p);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          psVar14 = puVar7 + 2;
          if ((size_type *)*puVar7 == psVar14) {
            uVar10 = puVar7[3];
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
            (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
          }
          __return_storage_ptr__->_M_string_length = puVar7[1];
          *puVar7 = psVar14;
          puVar7[1] = 0;
          *(undefined1 *)psVar14 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_210 != &local_200) {
          operator_delete(local_210);
        }
        if (local_1b0 != &local_1a0) {
          operator_delete(local_1b0);
        }
        if (local_1d0 != &local_1c0) {
          operator_delete(local_1d0);
        }
        if (local_190[0] != local_180) {
          operator_delete(local_190[0]);
        }
        ppuVar8 = local_1f0;
        if (local_1f0 == &local_1e0) goto LAB_00126b32;
        goto LAB_00126b2d;
      }
      ppuVar20 = &local_1c0;
      local_1d0 = ppuVar20;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,local_170._M_dataplus._M_p,
                 local_170._M_dataplus._M_p + local_170._M_string_length);
      std::__cxx11::string::append((char *)&local_1d0);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1d0,(ulong)local_130._M_dataplus._M_p);
      puVar13 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar13) {
        local_1a0 = *puVar13;
        lStack_198 = plVar6[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *puVar13;
        local_1b0 = (ulong *)*plVar6;
      }
      local_1a8 = plVar6[1];
      *plVar6 = (long)puVar13;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
      ppuVar8 = (ulong **)(puVar7 + 2);
      if ((ulong **)*puVar7 == ppuVar8) {
        local_200 = *ppuVar8;
        uStack_1f8 = puVar7[3];
        local_210 = &local_200;
      }
      else {
        local_200 = *ppuVar8;
        local_210 = (ulong **)*puVar7;
      }
      local_208 = puVar7[1];
      *puVar7 = ppuVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_110._M_dataplus._M_p)
      ;
      puVar13 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar13) {
        local_220 = *puVar13;
        lStack_218 = puVar7[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *puVar13;
        local_230 = (ulong *)*puVar7;
      }
      local_228 = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_230);
      ppuVar8 = (ulong **)(puVar7 + 2);
      if ((ulong **)*puVar7 == ppuVar8) {
        local_1e0 = *ppuVar8;
        uStack_1d8 = puVar7[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *ppuVar8;
        local_1f0 = (ulong **)*puVar7;
      }
      local_1e8 = puVar7[1];
      *puVar7 = ppuVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_150[0]);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar14 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar14) {
        lVar9 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230);
      }
      if (local_210 != &local_200) {
        operator_delete(local_210);
      }
      ppuVar8 = local_1d0;
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0);
        ppuVar8 = local_1d0;
      }
    }
    if (ppuVar8 == ppuVar20) goto LAB_00126b32;
  }
LAB_00126b2d:
  operator_delete(ppuVar8);
LAB_00126b32:
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::iType(string bin, int line){
    string op = AsmFuncts::getOpCode(bin.substr(0,6));
    string rs = AsmFuncts::getRegCode(bin.substr(6,5));
    string rt = AsmFuncts::getRegCode(bin.substr(11,5));
    string imm = std::to_string(Conversion::binToDec(bin.substr(16,16)));
    if((op == "sw") || (op == "lw")){
        return (op + " " + rt + ", " + imm + "(" + rs + ")");
    }
    if(op == "lui"){
        return (op + " " + rt + ", " + imm);
    }
    if((op == "bne")||(op == "beq")){
        string label = "LABEL_"+to_string(labelCount);
        int l = line + stoi(imm) + 1;
        if(!labelExists(l)){
          addLabel(l,label);
          return (op + " " + rs + ", " + rt + ", "+label);
        }
        else
          return (op + " " + rs + ", " + rt + ", "+getLabel(l));
    }
    return (op + " " + rt + ", " + rs + ", " + imm);
}